

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void __thiscall flatbuffers::ToStringVisitor::Double(ToStringVisitor *this,double x)

{
  string local_38;
  double local_18;
  double x_local;
  ToStringVisitor *this_local;
  
  local_18 = x;
  x_local = (double)this;
  NumToString<double>(&local_38,x);
  std::__cxx11::string::operator+=((string *)&this->s,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Double(double x) { s += NumToString(x); }